

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O3

IterateResult __thiscall
gl4cts::ShaderSubroutine::FunctionalTest14_15::iterate(FunctionalTest14_15 *this)

{
  pointer *ppuVar1;
  GLuint *pGVar2;
  GLuint *pGVar3;
  bool bVar4;
  GLuint GVar5;
  int iVar6;
  deUint32 dVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  size_t sVar8;
  NotSupportedError *this_00;
  char *pcVar9;
  byte bVar10;
  long lVar11;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *binary;
  char *__filename;
  bool bVar12;
  bool bVar13;
  long lVar14;
  buffer transform_feedback_buffer;
  GLenum binary_format;
  vertexArray vao;
  program program;
  vector<unsigned_char,_std::allocator<unsigned_char>_> program_binary;
  ios_base local_140 [272];
  
  if (iterate()::uni_input == '\0') {
    iterate();
  }
  if (iterate()::out_routine_1 == '\0') {
    iterate();
  }
  if (iterate()::out_routine_2 == '\0') {
    iterate();
  }
  bVar4 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,"GL_ARB_shader_subroutine");
  if (!bVar4) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    program_binary.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)&program_binary.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&program_binary,"GL_ARB_shader_subroutine is not supported.","");
    tcu::NotSupportedError::NotSupportedError(this_00,(string *)&program_binary);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  transform_feedback_buffer.m_context = (this->super_TestCase).m_context;
  program.m_tesselation_control_shader_id = 0;
  program.m_tesselation_evaluation_shader_id = 0;
  program.m_vertex_shader_id = 0;
  program.m_compute_shader_id = 0;
  program.m_fragment_shader_id = 0;
  program.m_geometry_shader_id = 0;
  program.m_program_object_id = 0;
  transform_feedback_buffer.m_id = 0;
  vao.m_id = 0;
  vao.m_context = transform_feedback_buffer.m_context;
  program.m_context = transform_feedback_buffer.m_context;
  bVar4 = Utils::program::isProgramBinarySupported(&program);
  Utils::program::build
            (&program,(GLchar *)0x0,(GLchar *)0x0,(GLchar *)0x0,(GLchar *)0x0,(GLchar *)0x0,
             "#version 400 core\n#extension GL_ARB_shader_subroutine : require\n\nprecision highp float;\n\nstruct data\n{\n    uint r;\n    uint g;\n    uint b;\n    uint a;\n};\n\nsubroutine void routine_type_1(in data iparam, out data oparam);\nsubroutine void routine_type_2(inout data arg);\n\nsubroutine (routine_type_1) void invert(in data iparam, out data oparam)\n{\n    oparam.r = iparam.a;\n    oparam.g = iparam.b;\n    oparam.b = iparam.g;\n    oparam.a = iparam.r;\n}\n\nsubroutine (routine_type_1) void increment(in data iparam, out data oparam)\n{\n    oparam.r = 1 + iparam.r;\n    oparam.g = 1 + iparam.g;\n    oparam.b = 1 + iparam.b;\n    oparam.a = 1 + iparam.a;\n}\n\nsubroutine (routine_type_2) void div_by_2(inout data arg)\n{\n    arg.r = arg.r / 2;\n    arg.g = arg.g / 2;\n    arg.b = arg.b / 2;\n    arg.a = arg.a / 2;\n}\n\nsubroutine (routine_type_2) void decrement(inout data arg)\n{\n    arg.r = arg.r - 1;\n    arg.g = arg.g - 1;\n    arg.b = arg.b - 1;\n    arg.a = arg.a - 1;\n}\n\nsubroutine uniform routine_type_1 routine_1;\nsubroutine uniform routine_type_2 routine_2;\n\nuniform uvec4 uni_input;\n\nout uvec4 out_routine_1;\nout uvec4 out_routine_2;\n\n\nvoid main()\n{\n    data routine_1_input;\n    data routine_1_output;\n    data routine_2_arg;\n\n    routine_1_input.r = uni_input.r;\n    routine_1_input.g = uni_input.g;\n    routine_1_input.b = uni_input.b;\n    routine_1_input.a = uni_input.a;\n\n    routine_2_arg.r = uni_input.r;\n    routine_2_arg.g = uni_input.g;\n    routine_2_arg.b = uni_input.b;\n    routine_2_arg.a = uni_input.a;\n\n    routine_1(routine_1_input, routine_1_output);\n    routine_2(routine_2_arg);\n\n    out_routine_1.r = routine_1_output.r;\n    out_routine_1.g = routine_1_output.g;\n    out_routine_1.b = routine_1_output.b;\n    out_routine_1.a = routine_1_output.a;\n\n    out_routine_2.r = routine_2_arg.r;\n    out_routine_2.g = routine_2_arg.g;\n    out_routine_2.b = routine_2_arg.b;\n    out_routine_2.a = routine_2_arg.a;\n}\n\n"
             ,iterate::varying_names,2,false);
  if (bVar4) {
    lVar14 = 0;
    bVar12 = true;
    do {
      bVar13 = bVar12;
      GVar5 = Utils::program::getSubroutineIndex
                        (&program,iterate::subroutine_names[lVar14][0],0x8b31);
      this->m_initial_subroutine_indices[lVar14][0] = GVar5;
      GVar5 = Utils::program::getSubroutineIndex
                        (&program,iterate::subroutine_names[lVar14][1],0x8b31);
      this->m_initial_subroutine_indices[lVar14][1] = GVar5;
      lVar14 = 1;
      bVar12 = false;
    } while (bVar13);
    lVar14 = 0;
    bVar12 = true;
    do {
      bVar13 = bVar12;
      GVar5 = Utils::program::getSubroutineUniformLocation
                        (&program,iterate::subroutine_uniform_names[lVar14],0x8b31);
      this->m_initial_subroutine_uniform_locations[lVar14] = GVar5;
      lVar14 = 1;
      bVar12 = false;
    } while (bVar13);
    binary = &program_binary;
    program_binary.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    program_binary.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    program_binary.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    Utils::program::getBinary(&program,binary,&binary_format);
    Utils::program::remove(&program,(char *)binary);
    Utils::program::createFromBinary(&program,&program_binary,binary_format);
    if (program_binary.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(program_binary.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)program_binary.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)program_binary.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  iVar6 = (*(program.m_context)->m_renderCtx->_vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var,iVar6) + 0x1680))(program.m_program_object_id);
  dVar7 = (**(code **)(CONCAT44(extraout_var,iVar6) + 0x800))();
  glu::checkError(dVar7,"UseProgram",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x28f);
  Utils::vertexArray::generate(&vao);
  iVar6 = (*(vao.m_context)->m_renderCtx->_vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var_00,iVar6) + 0xd8))(vao.m_id);
  dVar7 = (**(code **)(CONCAT44(extraout_var_00,iVar6) + 0x800))();
  glu::checkError(dVar7,"BindVertexArray",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x309);
  Utils::buffer::generate(&transform_feedback_buffer);
  Utils::buffer::update(&transform_feedback_buffer,0x8c8e,0x20,(GLvoid *)0x0,0x88ea);
  iVar6 = (*(transform_feedback_buffer.m_context)->m_renderCtx->_vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var_01,iVar6) + 0x50))
            (0x8c8e,0,transform_feedback_buffer.m_id,0,0x20);
  dVar7 = (**(code **)(CONCAT44(extraout_var_01,iVar6) + 0x800))();
  glu::checkError(dVar7,"BindBufferRange",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0x4e);
  lVar14 = 0;
  bVar12 = true;
  do {
    bVar13 = bVar12;
    GVar5 = Utils::program::getSubroutineIndex(&program,iterate::subroutine_names[lVar14][0],0x8b31)
    ;
    this->m_subroutine_indices[lVar14][0] = GVar5;
    GVar5 = Utils::program::getSubroutineIndex(&program,iterate::subroutine_names[lVar14][1],0x8b31)
    ;
    this->m_subroutine_indices[lVar14][1] = GVar5;
    lVar14 = 1;
    bVar12 = false;
  } while (bVar13);
  lVar14 = 0;
  bVar12 = true;
  do {
    bVar13 = bVar12;
    GVar5 = Utils::program::getSubroutineUniformLocation
                      (&program,iterate::subroutine_uniform_names[lVar14],0x8b31);
    this->m_subroutine_uniform_locations[lVar14] = GVar5;
    lVar14 = 1;
    bVar12 = false;
  } while (bVar13);
  GVar5 = Utils::program::getUniformLocation(&program,"uni_input");
  this->m_uniform_location = GVar5;
  bVar10 = 1;
  if (bVar4) {
    lVar14 = 0;
    bVar4 = true;
    bVar12 = true;
    do {
      bVar13 = bVar12;
      if ((bVar4) &&
         (this->m_subroutine_indices[lVar14][0] == this->m_initial_subroutine_indices[lVar14][0])) {
        bVar4 = this->m_subroutine_indices[lVar14][1] ==
                this->m_initial_subroutine_indices[lVar14][1];
      }
      else {
        bVar4 = false;
      }
      lVar14 = 1;
      bVar12 = false;
    } while (bVar13);
    lVar14 = 0;
    bVar12 = true;
    do {
      while (bVar13 = bVar12, !bVar4) {
        lVar14 = 1;
        bVar4 = false;
        bVar12 = false;
        if (!bVar13) goto LAB_00977480;
      }
      pGVar2 = this->m_subroutine_uniform_locations + lVar14;
      pGVar3 = this->m_initial_subroutine_uniform_locations + lVar14;
      bVar4 = *pGVar2 == *pGVar3;
      lVar14 = 1;
      bVar12 = false;
    } while (bVar13);
    bVar10 = 1;
    if (*pGVar2 != *pGVar3) {
LAB_00977480:
      program_binary.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)((this->super_TestCase).m_context)->m_testCtx->m_log;
      ppuVar1 = &program_binary.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)ppuVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)ppuVar1,
                 "Error. Subroutine indices or subroutine uniform location changed.",0x41);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&program_binary,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppuVar1);
      std::ios_base::~ios_base(local_140);
      lVar14 = 0;
      bVar4 = true;
      do {
        bVar12 = bVar4;
        lVar11 = 0;
        bVar4 = true;
        do {
          bVar13 = bVar4;
          program_binary.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)((this->super_TestCase).m_context)->m_testCtx->m_log;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)ppuVar1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)ppuVar1,"Subroutine: ",0xc);
          pcVar9 = iterate::subroutine_names[lVar14][lVar11];
          if (pcVar9 == (char *)0x0) {
            std::ios::clear((int)ppuVar1 +
                            (int)*(undefined8 *)
                                  (program_binary.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_finish + -0x18));
          }
          else {
            sVar8 = strlen(pcVar9);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)ppuVar1,pcVar9,sVar8);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)ppuVar1," index: ",8);
          std::ostream::_M_insert<unsigned_long>((ulong)ppuVar1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)ppuVar1," initial index: ",0x10);
          std::ostream::_M_insert<unsigned_long>((ulong)ppuVar1);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)&program_binary,(EndMessageToken *)&tcu::TestLog::EndMessage)
          ;
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppuVar1);
          std::ios_base::~ios_base(local_140);
          lVar11 = 1;
          bVar4 = false;
        } while (bVar13);
        lVar14 = 1;
        bVar4 = false;
      } while (bVar12);
      ppuVar1 = &program_binary.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      lVar14 = 0;
      bVar4 = true;
      do {
        bVar12 = bVar4;
        program_binary.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start =
             (pointer)((this->super_TestCase).m_context)->m_testCtx->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)ppuVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)ppuVar1,"Subroutine uniform: ",0x14);
        pcVar9 = iterate::subroutine_uniform_names[lVar14];
        sVar8 = strlen(pcVar9);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)ppuVar1,pcVar9,sVar8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)ppuVar1," location: ",0xb);
        std::ostream::_M_insert<unsigned_long>((ulong)ppuVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)ppuVar1," initial location: ",0x13);
        std::ostream::_M_insert<unsigned_long>((ulong)ppuVar1);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)&program_binary,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppuVar1);
        std::ios_base::~ios_base(local_140);
        lVar14 = 1;
        bVar10 = 0;
        bVar4 = false;
      } while (bVar12);
    }
    bVar4 = testDefaultSubroutineSet
                      (this,iterate::uni_input,iterate::out_routine_1,iterate::out_routine_2);
    bVar10 = bVar4 & bVar10;
  }
  lVar14 = 0;
  bVar4 = true;
  do {
    bVar12 = bVar4;
    bVar4 = testDraw(this,(GLuint)lVar14,iterate::uni_input + lVar14,iterate::out_routine_1 + lVar14
                     ,iterate::out_routine_2 + lVar14);
    bVar10 = bVar10 & bVar4;
    lVar14 = 1;
    bVar4 = false;
  } while (bVar12);
  __filename = (char *)(ulong)(bVar10 ^ 1);
  pcVar9 = "Fail";
  if (bVar10 != 0) {
    pcVar9 = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)(bVar10 ^ 1),
             pcVar9);
  Utils::vertexArray::~vertexArray(&vao);
  Utils::buffer::~buffer(&transform_feedback_buffer);
  Utils::program::remove(&program,__filename);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult FunctionalTest14_15::iterate()
{
	static const GLchar* vertex_shader_code =
		"#version 400 core\n"
		"#extension GL_ARB_shader_subroutine : require\n"
		"\n"
		"precision highp float;\n"
		"\n"
		"struct data\n"
		"{\n"
		"    uint r;\n"
		"    uint g;\n"
		"    uint b;\n"
		"    uint a;\n"
		"};\n"
		"\n"
		"subroutine void routine_type_1(in data iparam, out data oparam);\n"
		"subroutine void routine_type_2(inout data arg);\n"
		"\n"
		"subroutine (routine_type_1) void invert(in data iparam, out data oparam)\n"
		"{\n"
		"    oparam.r = iparam.a;\n"
		"    oparam.g = iparam.b;\n"
		"    oparam.b = iparam.g;\n"
		"    oparam.a = iparam.r;\n"
		"}\n"
		"\n"
		"subroutine (routine_type_1) void increment(in data iparam, out data oparam)\n"
		"{\n"
		"    oparam.r = 1 + iparam.r;\n"
		"    oparam.g = 1 + iparam.g;\n"
		"    oparam.b = 1 + iparam.b;\n"
		"    oparam.a = 1 + iparam.a;\n"
		"}\n"
		"\n"
		"subroutine (routine_type_2) void div_by_2(inout data arg)\n"
		"{\n"
		"    arg.r = arg.r / 2;\n"
		"    arg.g = arg.g / 2;\n"
		"    arg.b = arg.b / 2;\n"
		"    arg.a = arg.a / 2;\n"
		"}\n"
		"\n"
		"subroutine (routine_type_2) void decrement(inout data arg)\n"
		"{\n"
		"    arg.r = arg.r - 1;\n"
		"    arg.g = arg.g - 1;\n"
		"    arg.b = arg.b - 1;\n"
		"    arg.a = arg.a - 1;\n"
		"}\n"
		"\n"
		"subroutine uniform routine_type_1 routine_1;\n"
		"subroutine uniform routine_type_2 routine_2;\n"
		"\n"
		"uniform uvec4 uni_input;\n"
		"\n"
		"out uvec4 out_routine_1;\n"
		"out uvec4 out_routine_2;\n"
		"\n"
		"\n"
		"void main()\n"
		"{\n"
		"    data routine_1_input;\n"
		"    data routine_1_output;\n"
		"    data routine_2_arg;\n"
		"\n"
		"    routine_1_input.r = uni_input.r;\n"
		"    routine_1_input.g = uni_input.g;\n"
		"    routine_1_input.b = uni_input.b;\n"
		"    routine_1_input.a = uni_input.a;\n"
		"\n"
		"    routine_2_arg.r = uni_input.r;\n"
		"    routine_2_arg.g = uni_input.g;\n"
		"    routine_2_arg.b = uni_input.b;\n"
		"    routine_2_arg.a = uni_input.a;\n"
		"\n"
		"    routine_1(routine_1_input, routine_1_output);\n"
		"    routine_2(routine_2_arg);\n"
		"\n"
		"    out_routine_1.r = routine_1_output.r;\n"
		"    out_routine_1.g = routine_1_output.g;\n"
		"    out_routine_1.b = routine_1_output.b;\n"
		"    out_routine_1.a = routine_1_output.a;\n"
		"\n"
		"    out_routine_2.r = routine_2_arg.r;\n"
		"    out_routine_2.g = routine_2_arg.g;\n"
		"    out_routine_2.b = routine_2_arg.b;\n"
		"    out_routine_2.a = routine_2_arg.a;\n"
		"}\n"
		"\n";

	static const GLchar* subroutine_names[][2] = { { "invert", "increment" }, { "div_by_2", "decrement" } };
	static const GLuint  n_subroutine_types	= sizeof(subroutine_names) / sizeof(subroutine_names[0]);

	static const GLchar* subroutine_uniform_names[] = { "routine_1", "routine_2" };
	static const GLuint  n_subroutine_uniform_names =
		sizeof(subroutine_uniform_names) / sizeof(subroutine_uniform_names[0]);

	static const GLchar* uniform_name	= "uni_input";
	static const GLchar* varying_names[] = { "out_routine_1", "out_routine_2" };

	static const GLuint n_varying_names				   = sizeof(varying_names) / sizeof(varying_names[0]);
	static const GLuint transform_feedback_buffer_size = n_varying_names * 4 * sizeof(GLuint);

	/* Test data */
	static const Utils::vec4<GLuint> uni_input[] = { Utils::vec4<GLuint>(8, 64, 4096, 16777216),
													 Utils::vec4<GLuint>(8, 64, 4096, 16777216) };

	static const Utils::vec4<GLuint> out_routine_1[] = { Utils::vec4<GLuint>(16777216, 4096, 64, 8),
														 Utils::vec4<GLuint>(9, 65, 4097, 16777217) };

	static const Utils::vec4<GLuint> out_routine_2[] = { Utils::vec4<GLuint>(4, 32, 2048, 8388608),
														 Utils::vec4<GLuint>(7, 63, 4095, 16777215) };

	static const GLuint n_test_cases = 2;

	/* Do not execute the test if GL_ARB_shader_subroutine is not supported */
	if (!m_context.getContextInfo().isExtensionSupported("GL_ARB_shader_subroutine"))
	{
		throw tcu::NotSupportedError("GL_ARB_shader_subroutine is not supported.");
	}

	/* GL objects */
	Utils::program	 program(m_context);
	Utils::buffer	  transform_feedback_buffer(m_context);
	Utils::vertexArray vao(m_context);

	bool is_program_binary_supported = program.isProgramBinarySupported();

	/* Init GL objects */
	program.build(0 /* cs */, 0 /* fs */, 0 /* gs */, 0 /* tcs */, 0 /* test */, vertex_shader_code,
				  varying_names /* varying_names */, n_varying_names /* n_varyings */);

	/* Do not execute the test if GL_ARB_get_program_binary is not supported */
	if (true == is_program_binary_supported)
	{
		/* Get subroutine indices */
		for (GLuint type = 0; type < n_subroutine_types; ++type)
		{
			m_initial_subroutine_indices[type][0] =
				program.getSubroutineIndex(subroutine_names[type][0], GL_VERTEX_SHADER);

			m_initial_subroutine_indices[type][1] =
				program.getSubroutineIndex(subroutine_names[type][1], GL_VERTEX_SHADER);
		}

		/* Get subroutine uniform locations */
		for (GLuint uniform = 0; uniform < n_subroutine_uniform_names; ++uniform)
		{
			m_initial_subroutine_uniform_locations[uniform] =
				program.getSubroutineUniformLocation(subroutine_uniform_names[uniform], GL_VERTEX_SHADER);
		}

		/* Delete program and recreate it from binary */
		std::vector<GLubyte> program_binary;
		GLenum				 binary_format;

		program.getBinary(program_binary, binary_format);
		program.remove();
		program.createFromBinary(program_binary, binary_format);
	}

	program.use();

	vao.generate();
	vao.bind();

	transform_feedback_buffer.generate();
	transform_feedback_buffer.update(GL_TRANSFORM_FEEDBACK_BUFFER, transform_feedback_buffer_size, 0 /* data */,
									 GL_DYNAMIC_COPY);
	transform_feedback_buffer.bindRange(GL_TRANSFORM_FEEDBACK_BUFFER, 0, 0, transform_feedback_buffer_size);

	/* Get subroutine indices */
	for (GLuint type = 0; type < n_subroutine_types; ++type)
	{
		m_subroutine_indices[type][0] = program.getSubroutineIndex(subroutine_names[type][0], GL_VERTEX_SHADER);
		m_subroutine_indices[type][1] = program.getSubroutineIndex(subroutine_names[type][1], GL_VERTEX_SHADER);
	}

	/* Get subroutine uniform locations */
	for (GLuint uniform = 0; uniform < n_subroutine_uniform_names; ++uniform)
	{
		m_subroutine_uniform_locations[uniform] =
			program.getSubroutineUniformLocation(subroutine_uniform_names[uniform], GL_VERTEX_SHADER);
	}

	/* Get uniform locations */
	m_uniform_location = program.getUniformLocation(uniform_name);

	/* Test */
	bool result = true;

	/* Test program binary */
	if (true == is_program_binary_supported)
	{
		/* Test indices and locations */
		if (false == testIndicesAndLocations())
		{
			static const GLuint n_subroutines_per_type = 2;

			m_context.getTestContext().getLog() << tcu::TestLog::Message
												<< "Error. Subroutine indices or subroutine uniform location changed."
												<< tcu::TestLog::EndMessage;

			for (GLuint type = 0; type < n_subroutine_types; ++type)
			{
				for (GLuint i = 0; i < n_subroutines_per_type; ++i)
				{
					m_context.getTestContext().getLog()
						<< tcu::TestLog::Message << "Subroutine: " << subroutine_names[type][i]
						<< " index: " << m_subroutine_indices[type][i]
						<< " initial index: " << m_initial_subroutine_indices[type][i] << tcu::TestLog::EndMessage;
				}
			}

			for (GLuint uniform = 0; uniform < n_subroutine_uniform_names; ++uniform)
			{
				m_context.getTestContext().getLog()
					<< tcu::TestLog::Message << "Subroutine uniform: " << subroutine_uniform_names[uniform]
					<< " location: " << m_subroutine_uniform_locations[uniform]
					<< " initial location: " << m_initial_subroutine_uniform_locations[uniform]
					<< tcu::TestLog::EndMessage;
			}

			result = false;
		}

		/* Test draw with deafult set of subroutines */
		if (false == testDefaultSubroutineSet(uni_input[0], out_routine_1, out_routine_2))
		{
			result = false;
		}
	}

	for (GLuint i = 0; i < n_test_cases; ++i)
	{
		if (false == testDraw(i, uni_input[i], out_routine_1[i], out_routine_2[i]))
		{
			result = false;
		}
	}

	/* Set result */
	if (true == result)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	/* Done */
	return tcu::TestNode::STOP;
}